

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetObjectSources
          (cmGeneratorTarget *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data,string *config)

{
  pointer *pppcVar1;
  pointer pSVar2;
  iterator __position;
  pointer ppcVar3;
  KindedSources *pKVar4;
  pointer ppcVar5;
  SourceAndKind *s;
  pointer __args;
  cmSourceFile *it;
  cmSourceFile *local_30;
  
  pKVar4 = GetKindedSources(this,config);
  pSVar2 = (pKVar4->Sources).
           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__args = (pKVar4->Sources).
                super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                ._M_impl.super__Vector_impl_data._M_start; __args != pSVar2; __args = __args + 1) {
    if (__args->Kind == SourceKindObjectSource) {
      __position._M_current =
           (data->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>::
        _M_realloc_insert<cmSourceFile_const*const&>
                  ((vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>> *)data,
                   __position,(cmSourceFile **)__args);
      }
      else {
        *__position._M_current = (__args->Source).Value;
        pppcVar1 = &(data->
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>)
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
  }
  if ((this->Objects)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ppcVar5 = (data->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppcVar3 = (data->super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar5 != ppcVar3) {
      do {
        local_30 = *ppcVar5;
        std::
        map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&this->Objects,&local_30);
        ppcVar5 = ppcVar5 + 1;
      } while (ppcVar5 != ppcVar3);
    }
    (*this->LocalGenerator->_vptr_cmLocalGenerator[0xe])(this->LocalGenerator,&this->Objects,this);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetObjectSources(
  std::vector<cmSourceFile const*>& data, const std::string& config) const
{
  IMPLEMENT_VISIT(SourceKindObjectSource);

  if (!this->Objects.empty()) {
    return;
  }

  for (cmSourceFile const* it : data) {
    this->Objects[it];
  }

  this->LocalGenerator->ComputeObjectFilenames(this->Objects, this);
}